

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

bool FileExpand::inflate(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint8_t *data,
                        size_t dataSize)

{
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> this;
  long in_RDX;
  long in_RSI;
  exception *e;
  filtering_ostream os;
  zlib_params params;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe54;
  streamsize in_stack_fffffffffffffe58;
  filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
  *in_stack_fffffffffffffe60;
  basic_zlib_decompressor<std::allocator<char>_> *in_stack_fffffffffffffe68;
  chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe70;
  zlib_params local_38 [2];
  
  if ((in_RSI != 0) && (in_RDX != 0)) {
    uVar2 = 0;
    uVar1 = 0;
    boost::iostreams::zlib_params::zlib_params(local_38,-1,8,0xf,8,0,false,false);
    local_38[0].window_bits = -0xf;
    boost::iostreams::
    filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::filtering_stream(in_stack_fffffffffffffe60);
    boost::iostreams::basic_zlib_decompressor<std::allocator<char>_>::basic_zlib_decompressor
              ((basic_zlib_decompressor<std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe54,uVar2),
               (zlib_params *)CONCAT44(in_stack_fffffffffffffe4c,uVar1),0x11adb1);
    boost::iostreams::detail::
    chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
    ::push<boost::iostreams::basic_zlib_decompressor<std::allocator<char>>>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (streamsize)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (type *)CONCAT44(in_stack_fffffffffffffe54,uVar2));
    boost::iostreams::basic_zlib_decompressor<std::allocator<char>_>::~basic_zlib_decompressor
              ((basic_zlib_decompressor<std::allocator<char>_> *)0x11addd);
    this = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_fffffffffffffe4c,uVar1));
    boost::iostreams::detail::
    chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
    ::push<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this.container,
               (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffe68,(streamsize)this.container,in_stack_fffffffffffffe58,
               (type *)CONCAT44(in_stack_fffffffffffffe54,uVar2));
    boost::iostreams::
    write<boost::iostreams::filtering_stream<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::public_>>
              ((filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                *)CONCAT44(in_stack_fffffffffffffe54,uVar2),
               (type *)CONCAT44(in_stack_fffffffffffffe4c,uVar1),0x11ae35);
    boost::iostreams::
    filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::~filtering_stream((filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                         *)CONCAT44(in_stack_fffffffffffffe54,uVar2));
  }
  return true;
}

Assistant:

bool FileExpand::inflate(std::vector<uint8_t>& out, const uint8_t* data, size_t dataSize) {
	if (data && dataSize > 0) {
		try {
			boost::iostreams::zlib_params params;
			params.window_bits = -boost::iostreams::zlib::default_window_bits;
			
			boost::iostreams::filtering_ostream os;
			os.push(boost::iostreams::zlib_decompressor(params));
			os.push(std::back_inserter(out));
			
			boost::iostreams::write(os, reinterpret_cast<const char*>(data), dataSize);
		}
		catch (const std::exception& e) {
			return false;
		}
	}
	
	return true;
}